

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::ExtendTransitions(TimeZoneInfo *this)

{
  int iVar1;
  pointer pTVar2;
  value_type *__x;
  bool bVar3;
  uint uVar4;
  weekday wVar5;
  diff_t dVar6;
  int_fast64_t iVar7;
  int_fast64_t iVar8;
  value_type *__x_00;
  uint_fast8_t tt1_index;
  int jan1_weekday;
  ulong uVar9;
  long year;
  uint_least8_t dst_ti;
  uint_least8_t std_ti;
  TimeZoneInfo *local_140;
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  *local_138;
  int_fast64_t local_130;
  long local_128;
  PosixTimeZone posix;
  value_type local_a0;
  value_type local_70;
  civil_second jan1;
  
  this->extended_ = false;
  if ((this->future_spec_)._M_string_length == 0) {
    return true;
  }
  posix.std_abbr._M_dataplus._M_p = (pointer)&posix.std_abbr.field_2;
  posix.std_abbr._M_string_length = 0;
  posix.std_abbr.field_2._M_local_buf[0] = '\0';
  posix.dst_abbr._M_dataplus._M_p = (pointer)&posix.dst_abbr.field_2;
  posix.dst_abbr._M_string_length = 0;
  posix.dst_abbr.field_2._M_local_buf[0] = '\0';
  bVar3 = ParsePosixSpec(&this->future_spec_,&posix);
  if ((bVar3) &&
     (bVar3 = GetTransitionType(this,posix.std_offset,false,&posix.std_abbr,&std_ti), bVar3)) {
    if (posix.dst_abbr._M_string_length == 0) {
      tt1_index = (this->transitions_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
      dst_ti = std_ti;
    }
    else {
      bVar3 = GetTransitionType(this,posix.dst_offset,true,&posix.dst_abbr,&dst_ti);
      if (!bVar3) goto LAB_003fa065;
      if ((((posix.dst_start.date.fmt != N) ||
           (posix.dst_start.date.field_1 != (anon_union_8_3_4e90bb4b_for_Date_1)0x0)) ||
          (posix.dst_start.time.offset != 0)) ||
         (((posix.dst_end.date.fmt != J ||
           (posix.dst_end.date.field_1 != (anon_union_8_3_4e90bb4b_for_Date_1)0x16d)) ||
          ((posix.std_offset - posix.dst_offset) + posix.dst_end.time.offset != 0x15180)))) {
        local_138 = &this->transitions_;
        std::
        vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
        ::reserve(local_138,
                  ((long)(this->transitions_).
                         super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->transitions_).
                        super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30 + 0x324);
        this->extended_ = true;
        pTVar2 = (this->transitions_).
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_130 = pTVar2[-1].unix_time;
        LocalTime((absolute_lookup *)&local_70,this,local_130,
                  (this->transition_types_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                  ._M_impl.super__Vector_impl_data._M_start + pTVar2[-1].type_index);
        this->last_year_ = local_70.unix_time;
        local_140 = this;
        bVar3 = cctz::anon_unknown_0::IsLeap(local_70.unix_time);
        uVar4 = (uint)bVar3;
        jan1.f_.y = local_70.unix_time;
        jan1.f_._12_4_ = jan1.f_._12_4_ & 0xffffff00;
        jan1.f_.m = '\x01';
        jan1.f_.d = '\x01';
        jan1.f_.hh = '\0';
        jan1.f_.mm = '\0';
        dVar6 = detail::difference((detail *)local_70.unix_time,CONCAT44(jan1.f_._12_4_,0x101),0x7b2
                                   ,0x101);
        wVar5 = detail::get_weekday(&jan1);
        uVar9 = (ulong)(wVar5 + tuesday);
        if (saturday < wVar5) {
          uVar9 = 0;
        }
        local_70.unix_time = 0;
        local_70.type_index = dst_ti;
        local_70.civil_sec.f_.y = 0x7b2;
        local_70.civil_sec.f_.m = '\x01';
        local_70.civil_sec.f_.d = '\x01';
        local_70.civil_sec.f_.hh = '\0';
        local_70.civil_sec.f_.mm = '\0';
        local_70.civil_sec.f_.ss = '\0';
        local_70.prev_civil_sec.f_.y = 0x7b2;
        local_70.prev_civil_sec.f_.m = '\x01';
        local_70.prev_civil_sec.f_.d = '\x01';
        local_70.prev_civil_sec.f_.hh = '\0';
        local_70.prev_civil_sec.f_.mm = '\0';
        local_70.prev_civil_sec.f_.ss = '\0';
        local_a0.type_index = std_ti;
        local_a0.civil_sec.f_.y = 0x7b2;
        local_a0.civil_sec.f_.m = '\x01';
        local_a0.civil_sec.f_.d = '\x01';
        local_a0.civil_sec.f_.hh = '\0';
        local_a0.civil_sec.f_.mm = '\0';
        local_a0.civil_sec.f_.ss = '\0';
        local_a0.prev_civil_sec.f_.y = 0x7b2;
        local_a0.prev_civil_sec.f_.m = '\x01';
        local_a0.prev_civil_sec.f_.d = '\x01';
        local_a0.prev_civil_sec.f_.hh = '\0';
        local_a0.prev_civil_sec.f_.mm = '\0';
        local_a0.prev_civil_sec.f_.ss = '\0';
        year = local_140->last_year_;
        local_128 = year + 0x191;
        while( true ) {
          jan1_weekday = (int)uVar9;
          iVar7 = cctz::anon_unknown_0::TransOffset(SUB41(uVar4,0),jan1_weekday,&posix.dst_start);
          iVar8 = cctz::anon_unknown_0::TransOffset(SUB41(uVar4,0),jan1_weekday,&posix.dst_end);
          local_70.unix_time = (iVar7 + dVar6) - posix.std_offset;
          local_a0.unix_time = (iVar8 + dVar6) - posix.dst_offset;
          __x_00 = &local_70;
          __x = &local_a0;
          if (local_70.unix_time < local_a0.unix_time) {
            __x_00 = &local_a0;
            __x = &local_70;
          }
          if (local_130 < __x_00->unix_time) {
            if (local_130 < __x->unix_time) {
              std::
              vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
              ::push_back(local_138,__x);
            }
            std::
            vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
            ::push_back(local_138,__x_00);
            year = local_140->last_year_;
          }
          if (year == local_128) break;
          iVar1 = *(int *)((long)&cctz::(anonymous_namespace)::kSecsPerYear + (ulong)(uVar4 * 4));
          year = year + 1;
          uVar9 = (long)(jan1_weekday +
                        *(int *)((long)&cctz::(anonymous_namespace)::kDaysPerYear +
                                (ulong)(uVar4 * 4))) % 7 & 0xffffffff;
          if (uVar4 == 0) {
            bVar3 = cctz::anon_unknown_0::IsLeap(year);
            uVar4 = (uint)bVar3;
          }
          else {
            uVar4 = 0;
          }
          dVar6 = dVar6 + iVar1;
          local_140->last_year_ = year;
        }
        bVar3 = true;
        goto LAB_003fa067;
      }
      tt1_index = (this->transitions_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
    }
    bVar3 = EquivTransitions(this,tt1_index,dst_ti);
  }
  else {
LAB_003fa065:
    bVar3 = false;
  }
LAB_003fa067:
  PosixTimeZone::~PosixTimeZone(&posix);
  return bVar3;
}

Assistant:

bool TimeZoneInfo::ExtendTransitions() {
  extended_ = false;
  if (future_spec_.empty()) return true;  // last transition prevails

  PosixTimeZone posix;
  if (!ParsePosixSpec(future_spec_, &posix)) return false;

  // Find transition type for the future std specification.
  std::uint_least8_t std_ti;
  if (!GetTransitionType(posix.std_offset, false, posix.std_abbr, &std_ti))
    return false;

  if (posix.dst_abbr.empty()) {  // std only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, std_ti);
  }

  // Find transition type for the future dst specification.
  std::uint_least8_t dst_ti;
  if (!GetTransitionType(posix.dst_offset, true, posix.dst_abbr, &dst_ti))
    return false;

  if (AllYearDST(posix)) {  // dst only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, dst_ti);
  }

  // Extend the transitions for an additional 401 years using the future
  // specification. Years beyond those can be handled by mapping back to
  // a cycle-equivalent year within that range. Note that we need 401
  // (well, at least the first transition in the 401st year) so that the
  // end of the 400th year is mapped back to an extended year. And first
  // we may also need two additional transitions for the current year.
  transitions_.reserve(transitions_.size() + 2 + 401 * 2);
  extended_ = true;

  const Transition& last(transitions_.back());
  const std::int_fast64_t last_time = last.unix_time;
  const TransitionType& last_tt(transition_types_[last.type_index]);
  last_year_ = LocalTime(last_time, last_tt).cs.year();
  bool leap_year = IsLeap(last_year_);
  const civil_second jan1(last_year_);
  std::int_fast64_t jan1_time = jan1 - civil_second();
  int jan1_weekday = ToPosixWeekday(get_weekday(jan1));

  Transition dst = {0, dst_ti, civil_second(), civil_second()};
  Transition std = {0, std_ti, civil_second(), civil_second()};
  for (const year_t limit = last_year_ + 401;; ++last_year_) {
    auto dst_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_start);
    auto std_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_end);
    dst.unix_time = jan1_time + dst_trans_off - posix.std_offset;
    std.unix_time = jan1_time + std_trans_off - posix.dst_offset;
    const auto* ta = dst.unix_time < std.unix_time ? &dst : &std;
    const auto* tb = dst.unix_time < std.unix_time ? &std : &dst;
    if (last_time < tb->unix_time) {
      if (last_time < ta->unix_time) transitions_.push_back(*ta);
      transitions_.push_back(*tb);
    }
    if (last_year_ == limit) break;
    jan1_time += kSecsPerYear[leap_year];
    jan1_weekday = (jan1_weekday + kDaysPerYear[leap_year]) % 7;
    leap_year = !leap_year && IsLeap(last_year_ + 1);
  }

  return true;
}